

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

bool libwebm::GetFileContents(string *file_name,string *contents)

{
  uint uVar1;
  uint64_t uVar2;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  ifstream file;
  uint auStack_1f8 [122];
  
  std::ifstream::ifstream(&file,(file_name->_M_dataplus)._M_p,_S_in);
  uVar2 = GetFileSize(file_name);
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct((ulong)local_238,(char)uVar2);
  std::__cxx11::string::operator=((string *)contents,(string *)local_238);
  std::__cxx11::string::~string((string *)local_238);
  uVar1 = *(uint *)((long)auStack_1f8 + *(long *)(_file + -0x18));
  if (uVar1 == 0) {
    if (contents->_M_string_length == 0) {
      uVar1 = 0;
    }
    else {
      std::istream::read((char *)&file,(long)(contents->_M_dataplus)._M_p);
      uVar1 = *(uint *)((long)auStack_1f8 + *(long *)(_file + -0x18));
    }
  }
  std::ifstream::~ifstream(&file);
  return (uVar1 & 5) == 0;
}

Assistant:

bool GetFileContents(const std::string& file_name, std::string* contents) {
  std::ifstream file(file_name.c_str());
  *contents = std::string(static_cast<size_t>(GetFileSize(file_name)), 0);
  if (file.good() && contents->size()) {
    file.read(&(*contents)[0], contents->size());
  }
  return !file.fail();
}